

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  long lVar73;
  long lVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ushort uVar87;
  short sVar88;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  undefined1 auVar89 [16];
  ushort uVar96;
  short sVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  ushort uVar100;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  undefined1 auVar101 [16];
  ushort uVar108;
  undefined1 auVar109 [16];
  ushort uVar110;
  ushort uVar115;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  ushort uVar122;
  undefined1 auVar114 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  ushort uVar135;
  ushort uVar138;
  ushort uVar139;
  ushort uVar140;
  ushort uVar141;
  ushort uVar142;
  ushort uVar143;
  undefined1 auVar136 [16];
  ushort uVar144;
  undefined1 auVar137 [16];
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short sVar116;
  short sVar123;
  
  auVar83 = *(undefined1 (*) [16])(s + -(long)(p * 3));
  lVar74 = (long)(p * 2);
  auVar86 = *(undefined1 (*) [16])(s + -lVar74);
  lVar73 = (long)p;
  auVar98 = *(undefined1 (*) [16])(s + -lVar73);
  auVar99 = *(undefined1 (*) [16])s;
  auVar125 = *(undefined1 (*) [16])_blimit0;
  auVar128 = *(undefined1 (*) [16])_blimit1;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar125._0_13_;
  auVar7[0xe] = auVar125[7];
  auVar13[0xc] = auVar125[6];
  auVar13._0_12_ = auVar125._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar125._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar125[5];
  auVar25._0_10_ = auVar125._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar125._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar125[4];
  auVar37._0_8_ = auVar125._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar55._7_8_ = 0;
  auVar55._0_7_ = auVar37._8_7_;
  auVar61._1_8_ = SUB158(auVar55 << 0x40,7);
  auVar61[0] = auVar125[3];
  auVar61._9_6_ = 0;
  auVar62._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar62[0] = auVar125[2];
  auVar62._11_4_ = 0;
  auVar43[2] = auVar125[1];
  auVar43._0_2_ = auVar125._0_2_;
  auVar43._3_12_ = SUB1512(auVar62 << 0x20,3);
  auVar49._2_13_ = auVar43._2_13_;
  auVar49._0_2_ = auVar125._0_2_ & 0xff;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar128._0_13_;
  auVar8[0xe] = auVar128[7];
  auVar14[0xc] = auVar128[6];
  auVar14._0_12_ = auVar128._0_12_;
  auVar14._13_2_ = auVar8._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar128._0_11_;
  auVar20._12_3_ = auVar14._12_3_;
  auVar26[10] = auVar128[5];
  auVar26._0_10_ = auVar128._0_10_;
  auVar26._11_4_ = auVar20._11_4_;
  auVar32[9] = 0;
  auVar32._0_9_ = auVar128._0_9_;
  auVar32._10_5_ = auVar26._10_5_;
  auVar38[8] = auVar128[4];
  auVar38._0_8_ = auVar128._0_8_;
  auVar38._9_6_ = auVar32._9_6_;
  auVar56._7_8_ = 0;
  auVar56._0_7_ = auVar38._8_7_;
  auVar63._1_8_ = SUB158(auVar56 << 0x40,7);
  auVar63[0] = auVar128[3];
  auVar63._9_6_ = 0;
  auVar64._1_10_ = SUB1510(auVar63 << 0x30,5);
  auVar64[0] = auVar128[2];
  auVar64._11_4_ = 0;
  auVar44[2] = auVar128[1];
  auVar44._0_2_ = auVar128._0_2_;
  auVar44._3_12_ = SUB1512(auVar64 << 0x20,3);
  auVar50._2_13_ = auVar44._2_13_;
  auVar50._0_2_ = auVar128._0_2_ & 0xff;
  auVar125._0_8_ = auVar49._0_8_;
  auVar125._8_8_ = auVar50._0_8_;
  auVar84 = ZEXT416(bd - 8);
  auVar126 = psllw(auVar125,auVar84);
  auVar125 = *(undefined1 (*) [16])(s + lVar73);
  auVar128 = *(undefined1 (*) [16])_limit0;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar128._0_13_;
  auVar9[0xe] = auVar128[7];
  auVar15[0xc] = auVar128[6];
  auVar15._0_12_ = auVar128._0_12_;
  auVar15._13_2_ = auVar9._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar128._0_11_;
  auVar21._12_3_ = auVar15._12_3_;
  auVar27[10] = auVar128[5];
  auVar27._0_10_ = auVar128._0_10_;
  auVar27._11_4_ = auVar21._11_4_;
  auVar33[9] = 0;
  auVar33._0_9_ = auVar128._0_9_;
  auVar33._10_5_ = auVar27._10_5_;
  auVar39[8] = auVar128[4];
  auVar39._0_8_ = auVar128._0_8_;
  auVar39._9_6_ = auVar33._9_6_;
  auVar57._7_8_ = 0;
  auVar57._0_7_ = auVar39._8_7_;
  auVar65._1_8_ = SUB158(auVar57 << 0x40,7);
  auVar65[0] = auVar128[3];
  auVar65._9_6_ = 0;
  auVar66._1_10_ = SUB1510(auVar65 << 0x30,5);
  auVar66[0] = auVar128[2];
  auVar66._11_4_ = 0;
  auVar45[2] = auVar128[1];
  auVar45._0_2_ = auVar128._0_2_;
  auVar45._3_12_ = SUB1512(auVar66 << 0x20,3);
  auVar51._2_13_ = auVar45._2_13_;
  auVar51._0_2_ = auVar128._0_2_ & 0xff;
  auVar128 = *(undefined1 (*) [16])_limit1;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar128._0_13_;
  auVar10[0xe] = auVar128[7];
  auVar16[0xc] = auVar128[6];
  auVar16._0_12_ = auVar128._0_12_;
  auVar16._13_2_ = auVar10._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar128._0_11_;
  auVar22._12_3_ = auVar16._12_3_;
  auVar28[10] = auVar128[5];
  auVar28._0_10_ = auVar128._0_10_;
  auVar28._11_4_ = auVar22._11_4_;
  auVar34[9] = 0;
  auVar34._0_9_ = auVar128._0_9_;
  auVar34._10_5_ = auVar28._10_5_;
  auVar40[8] = auVar128[4];
  auVar40._0_8_ = auVar128._0_8_;
  auVar40._9_6_ = auVar34._9_6_;
  auVar58._7_8_ = 0;
  auVar58._0_7_ = auVar40._8_7_;
  auVar67._1_8_ = SUB158(auVar58 << 0x40,7);
  auVar67[0] = auVar128[3];
  auVar67._9_6_ = 0;
  auVar68._1_10_ = SUB1510(auVar67 << 0x30,5);
  auVar68[0] = auVar128[2];
  auVar68._11_4_ = 0;
  auVar46[2] = auVar128[1];
  auVar46._0_2_ = auVar128._0_2_;
  auVar46._3_12_ = SUB1512(auVar68 << 0x20,3);
  auVar52._2_13_ = auVar46._2_13_;
  auVar52._0_2_ = auVar128._0_2_ & 0xff;
  auVar128._0_8_ = auVar51._0_8_;
  auVar128._8_8_ = auVar52._0_8_;
  auVar129 = psllw(auVar128,auVar84);
  auVar128 = *(undefined1 (*) [16])(s + lVar74);
  auVar85 = *(undefined1 (*) [16])_thresh0;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar85._0_13_;
  auVar11[0xe] = auVar85[7];
  auVar17[0xc] = auVar85[6];
  auVar17._0_12_ = auVar85._0_12_;
  auVar17._13_2_ = auVar11._13_2_;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar85._0_11_;
  auVar23._12_3_ = auVar17._12_3_;
  auVar29[10] = auVar85[5];
  auVar29._0_10_ = auVar85._0_10_;
  auVar29._11_4_ = auVar23._11_4_;
  auVar35[9] = 0;
  auVar35._0_9_ = auVar85._0_9_;
  auVar35._10_5_ = auVar29._10_5_;
  auVar41[8] = auVar85[4];
  auVar41._0_8_ = auVar85._0_8_;
  auVar41._9_6_ = auVar35._9_6_;
  auVar59._7_8_ = 0;
  auVar59._0_7_ = auVar41._8_7_;
  auVar69._1_8_ = SUB158(auVar59 << 0x40,7);
  auVar69[0] = auVar85[3];
  auVar69._9_6_ = 0;
  auVar70._1_10_ = SUB1510(auVar69 << 0x30,5);
  auVar70[0] = auVar85[2];
  auVar70._11_4_ = 0;
  auVar47[2] = auVar85[1];
  auVar47._0_2_ = auVar85._0_2_;
  auVar47._3_12_ = SUB1512(auVar70 << 0x20,3);
  auVar53._2_13_ = auVar47._2_13_;
  auVar53._0_2_ = auVar85._0_2_ & 0xff;
  auVar85 = *(undefined1 (*) [16])_thresh1;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar85._0_13_;
  auVar12[0xe] = auVar85[7];
  auVar18[0xc] = auVar85[6];
  auVar18._0_12_ = auVar85._0_12_;
  auVar18._13_2_ = auVar12._13_2_;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar85._0_11_;
  auVar24._12_3_ = auVar18._12_3_;
  auVar30[10] = auVar85[5];
  auVar30._0_10_ = auVar85._0_10_;
  auVar30._11_4_ = auVar24._11_4_;
  auVar36[9] = 0;
  auVar36._0_9_ = auVar85._0_9_;
  auVar36._10_5_ = auVar30._10_5_;
  auVar42[8] = auVar85[4];
  auVar42._0_8_ = auVar85._0_8_;
  auVar42._9_6_ = auVar36._9_6_;
  auVar60._7_8_ = 0;
  auVar60._0_7_ = auVar42._8_7_;
  auVar71._1_8_ = SUB158(auVar60 << 0x40,7);
  auVar71[0] = auVar85[3];
  auVar71._9_6_ = 0;
  auVar72._1_10_ = SUB1510(auVar71 << 0x30,5);
  auVar72[0] = auVar85[2];
  auVar72._11_4_ = 0;
  auVar48[2] = auVar85[1];
  auVar48._0_2_ = auVar85._0_2_;
  auVar48._3_12_ = SUB1512(auVar72 << 0x20,3);
  auVar54._2_13_ = auVar48._2_13_;
  auVar54._0_2_ = auVar85._0_2_ & 0xff;
  auVar127._0_8_ = auVar53._0_8_;
  auVar127._8_8_ = auVar54._0_8_;
  auVar85 = psubusw(auVar83,auVar86);
  auVar101 = psubusw(auVar86,auVar83);
  auVar101 = auVar101 | auVar85;
  auVar85 = psubusw(auVar86,auVar98);
  auVar89 = psubusw(auVar98,auVar86);
  auVar89 = auVar89 | auVar85;
  auVar85 = psubusw(auVar125,auVar99);
  auVar111 = psubusw(auVar99,auVar125);
  auVar111 = auVar111 | auVar85;
  sVar75 = auVar89._0_2_;
  sVar76 = auVar111._0_2_;
  auVar112._0_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._2_2_;
  sVar76 = auVar111._2_2_;
  auVar112._2_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._4_2_;
  sVar76 = auVar111._4_2_;
  auVar112._4_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._6_2_;
  sVar76 = auVar111._6_2_;
  auVar112._6_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._8_2_;
  sVar76 = auVar111._8_2_;
  auVar112._8_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._10_2_;
  sVar76 = auVar111._10_2_;
  auVar112._10_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._12_2_;
  sVar76 = auVar111._12_2_;
  sVar77 = auVar111._14_2_;
  auVar112._12_2_ = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._14_2_;
  auVar112._14_2_ = (ushort)(sVar77 < sVar75) * sVar75 | (ushort)(sVar77 >= sVar75) * sVar77;
  auVar89 = psubusw(auVar128,auVar125);
  auVar85 = psubusw(auVar125,auVar128);
  auVar85 = auVar85 | auVar89;
  auVar89 = psubusw(auVar98,auVar99);
  auVar124 = psubusw(auVar99,auVar98);
  auVar111 = psubusw(auVar86,auVar125);
  auVar130 = psubusw(auVar125,auVar86);
  auVar130 = auVar130 | auVar111;
  auVar89 = paddusw(auVar124 | auVar89,auVar124 | auVar89);
  auVar131._0_2_ = auVar130._0_2_ >> 1;
  auVar131._2_2_ = auVar130._2_2_ >> 1;
  auVar131._4_2_ = auVar130._4_2_ >> 1;
  auVar131._6_2_ = auVar130._6_2_ >> 1;
  auVar131._8_2_ = auVar130._8_2_ >> 1;
  auVar131._10_2_ = auVar130._10_2_ >> 1;
  auVar131._12_2_ = auVar130._12_2_ >> 1;
  auVar131._14_2_ = auVar130._14_2_ >> 1;
  auVar89 = paddusw(auVar131,auVar89);
  auVar89 = auVar89 ^ _DAT_004d28e0;
  auVar126 = auVar126 ^ _DAT_004d28e0;
  auVar132._0_2_ = -(ushort)(auVar126._0_2_ < auVar89._0_2_);
  auVar132._2_2_ = -(ushort)(auVar126._2_2_ < auVar89._2_2_);
  auVar132._4_2_ = -(ushort)(auVar126._4_2_ < auVar89._4_2_);
  auVar132._6_2_ = -(ushort)(auVar126._6_2_ < auVar89._6_2_);
  auVar132._8_2_ = -(ushort)(auVar126._8_2_ < auVar89._8_2_);
  auVar132._10_2_ = -(ushort)(auVar126._10_2_ < auVar89._10_2_);
  auVar132._12_2_ = -(ushort)(auVar126._12_2_ < auVar89._12_2_);
  auVar132._14_2_ = -(ushort)(auVar126._14_2_ < auVar89._14_2_);
  auVar89 = paddusw(auVar129,_DAT_0050d500);
  auVar89 = auVar89 & auVar132;
  sVar75 = auVar85._0_2_;
  sVar76 = auVar89._0_2_;
  uVar87 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._2_2_;
  sVar76 = auVar89._2_2_;
  uVar90 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._4_2_;
  sVar76 = auVar89._4_2_;
  uVar91 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._6_2_;
  sVar76 = auVar89._6_2_;
  uVar92 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._8_2_;
  sVar76 = auVar89._8_2_;
  uVar93 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._10_2_;
  sVar76 = auVar89._10_2_;
  uVar94 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._12_2_;
  sVar76 = auVar89._12_2_;
  sVar77 = auVar89._14_2_;
  uVar95 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar85._14_2_;
  uVar96 = (ushort)(sVar77 < sVar75) * sVar75 | (ushort)(sVar77 >= sVar75) * sVar77;
  sVar75 = auVar101._0_2_;
  uVar100 = (sVar75 < (short)auVar112._0_2_) * auVar112._0_2_ |
            (ushort)(sVar75 >= (short)auVar112._0_2_) * sVar75;
  sVar75 = auVar101._2_2_;
  uVar102 = (sVar75 < (short)auVar112._2_2_) * auVar112._2_2_ |
            (ushort)(sVar75 >= (short)auVar112._2_2_) * sVar75;
  sVar75 = auVar101._4_2_;
  uVar103 = (sVar75 < (short)auVar112._4_2_) * auVar112._4_2_ |
            (ushort)(sVar75 >= (short)auVar112._4_2_) * sVar75;
  sVar75 = auVar101._6_2_;
  uVar104 = (sVar75 < (short)auVar112._6_2_) * auVar112._6_2_ |
            (ushort)(sVar75 >= (short)auVar112._6_2_) * sVar75;
  sVar75 = auVar101._8_2_;
  uVar105 = (sVar75 < (short)auVar112._8_2_) * auVar112._8_2_ |
            (ushort)(sVar75 >= (short)auVar112._8_2_) * sVar75;
  sVar75 = auVar101._10_2_;
  uVar106 = (sVar75 < (short)auVar112._10_2_) * auVar112._10_2_ |
            (ushort)(sVar75 >= (short)auVar112._10_2_) * sVar75;
  sVar75 = auVar101._12_2_;
  sVar76 = auVar101._14_2_;
  uVar107 = (sVar75 < (short)auVar112._12_2_) * auVar112._12_2_ |
            (ushort)(sVar75 >= (short)auVar112._12_2_) * sVar75;
  uVar108 = (sVar76 < (short)auVar112._14_2_) * auVar112._14_2_ |
            (ushort)(sVar76 >= (short)auVar112._14_2_) * sVar76;
  auVar85._0_2_ =
       ((short)uVar100 < (short)uVar87) * uVar87 | ((short)uVar100 >= (short)uVar87) * uVar100;
  auVar85._2_2_ =
       ((short)uVar102 < (short)uVar90) * uVar90 | ((short)uVar102 >= (short)uVar90) * uVar102;
  auVar85._4_2_ =
       ((short)uVar103 < (short)uVar91) * uVar91 | ((short)uVar103 >= (short)uVar91) * uVar103;
  auVar85._6_2_ =
       ((short)uVar104 < (short)uVar92) * uVar92 | ((short)uVar104 >= (short)uVar92) * uVar104;
  auVar85._8_2_ =
       ((short)uVar105 < (short)uVar93) * uVar93 | ((short)uVar105 >= (short)uVar93) * uVar105;
  auVar85._10_2_ =
       ((short)uVar106 < (short)uVar94) * uVar94 | ((short)uVar106 >= (short)uVar94) * uVar106;
  auVar85._12_2_ =
       ((short)uVar107 < (short)uVar95) * uVar95 | ((short)uVar107 >= (short)uVar95) * uVar107;
  auVar85._14_2_ =
       ((short)uVar108 < (short)uVar96) * uVar96 | ((short)uVar108 >= (short)uVar96) * uVar108;
  auVar85 = auVar85 ^ _DAT_004d28e0;
  auVar129 = auVar129 ^ _DAT_004d28e0;
  auVar130._0_2_ = -(ushort)(auVar129._0_2_ < auVar85._0_2_);
  auVar130._2_2_ = -(ushort)(auVar129._2_2_ < auVar85._2_2_);
  auVar130._4_2_ = -(ushort)(auVar129._4_2_ < auVar85._4_2_);
  auVar130._6_2_ = -(ushort)(auVar129._6_2_ < auVar85._6_2_);
  auVar130._8_2_ = -(ushort)(auVar129._8_2_ < auVar85._8_2_);
  auVar130._10_2_ = -(ushort)(auVar129._10_2_ < auVar85._10_2_);
  auVar130._12_2_ = -(ushort)(auVar129._12_2_ < auVar85._12_2_);
  auVar130._14_2_ = -(ushort)(auVar129._14_2_ < auVar85._14_2_);
  auVar101 = psllw(_DAT_0050d500,ZEXT416((uint)bd));
  auVar85 = psubusw(auVar128,auVar99);
  auVar89 = psubusw(auVar99,auVar128);
  auVar89 = auVar89 | auVar85;
  auVar85 = psubusw(auVar83,auVar98);
  auVar124 = psubusw(auVar98,auVar83);
  auVar124 = auVar124 | auVar85;
  auVar111 = psllw(auVar127,auVar84);
  sVar75 = auVar89._0_2_;
  sVar76 = auVar124._0_2_;
  uVar87 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._2_2_;
  sVar76 = auVar124._2_2_;
  uVar90 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._4_2_;
  sVar76 = auVar124._4_2_;
  uVar91 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._6_2_;
  sVar76 = auVar124._6_2_;
  uVar92 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._8_2_;
  sVar76 = auVar124._8_2_;
  uVar93 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._10_2_;
  sVar76 = auVar124._10_2_;
  uVar94 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._12_2_;
  sVar76 = auVar124._12_2_;
  sVar77 = auVar124._14_2_;
  uVar95 = (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
  sVar75 = auVar89._14_2_;
  uVar96 = (ushort)(sVar77 < sVar75) * sVar75 | (ushort)(sVar77 >= sVar75) * sVar77;
  auVar85 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar85 = pshuflw(auVar85,auVar85,0);
  auVar89._0_4_ = auVar85._0_4_;
  auVar89._4_4_ = auVar89._0_4_;
  auVar89._8_4_ = auVar89._0_4_;
  auVar89._12_4_ = auVar89._0_4_;
  auVar127 = psllw(_DAT_0050d500,auVar84);
  auVar124 = psubsw(auVar98,auVar89);
  auVar133._0_2_ =
       ((short)uVar87 < (short)auVar112._0_2_) * auVar112._0_2_ |
       ((short)uVar87 >= (short)auVar112._0_2_) * uVar87;
  auVar133._2_2_ =
       ((short)uVar90 < (short)auVar112._2_2_) * auVar112._2_2_ |
       ((short)uVar90 >= (short)auVar112._2_2_) * uVar90;
  auVar133._4_2_ =
       ((short)uVar91 < (short)auVar112._4_2_) * auVar112._4_2_ |
       ((short)uVar91 >= (short)auVar112._4_2_) * uVar91;
  auVar133._6_2_ =
       ((short)uVar92 < (short)auVar112._6_2_) * auVar112._6_2_ |
       ((short)uVar92 >= (short)auVar112._6_2_) * uVar92;
  auVar133._8_2_ =
       ((short)uVar93 < (short)auVar112._8_2_) * auVar112._8_2_ |
       ((short)uVar93 >= (short)auVar112._8_2_) * uVar93;
  auVar133._10_2_ =
       ((short)uVar94 < (short)auVar112._10_2_) * auVar112._10_2_ |
       ((short)uVar94 >= (short)auVar112._10_2_) * uVar94;
  auVar133._12_2_ =
       ((short)uVar95 < (short)auVar112._12_2_) * auVar112._12_2_ |
       ((short)uVar95 >= (short)auVar112._12_2_) * uVar95;
  auVar133._14_2_ =
       ((short)uVar96 < (short)auVar112._14_2_) * auVar112._14_2_ |
       ((short)uVar96 >= (short)auVar112._14_2_) * uVar96;
  auVar112 = auVar112 ^ _DAT_004d28e0;
  auVar111 = auVar111 ^ _DAT_004d28e0;
  auVar113._0_2_ = -(ushort)(auVar111._0_2_ < auVar112._0_2_);
  auVar113._2_2_ = -(ushort)(auVar111._2_2_ < auVar112._2_2_);
  auVar113._4_2_ = -(ushort)(auVar111._4_2_ < auVar112._4_2_);
  auVar113._6_2_ = -(ushort)(auVar111._6_2_ < auVar112._6_2_);
  auVar113._8_2_ = -(ushort)(auVar111._8_2_ < auVar112._8_2_);
  auVar113._10_2_ = -(ushort)(auVar111._10_2_ < auVar112._10_2_);
  auVar113._12_2_ = -(ushort)(auVar111._12_2_ < auVar112._12_2_);
  auVar113._14_2_ = -(ushort)(auVar111._14_2_ < auVar112._14_2_);
  auVar85 = psubsw(auVar86,auVar89);
  auVar126 = psubsw(auVar99,auVar89);
  auVar129 = psubsw(auVar125,auVar89);
  auVar84._8_4_ = 0xffffffff;
  auVar84._0_8_ = 0xffffffffffffffff;
  auVar84._12_4_ = 0xffffffff;
  auVar84 = paddsw(auVar101,auVar84);
  auVar111 = psubsw(auVar84,auVar89);
  auVar101 = psubsw((undefined1  [16])0x0,auVar89);
  auVar84 = psubsw(auVar85,auVar129);
  sVar116 = auVar111._0_2_;
  sVar75 = auVar84._0_2_;
  uVar87 = (ushort)(sVar116 < sVar75) * sVar116 | (ushort)(sVar116 >= sVar75) * sVar75;
  sVar123 = auVar111._2_2_;
  sVar75 = auVar84._2_2_;
  uVar90 = (ushort)(sVar123 < sVar75) * sVar123 | (ushort)(sVar123 >= sVar75) * sVar75;
  sVar1 = auVar111._4_2_;
  sVar75 = auVar84._4_2_;
  uVar91 = (ushort)(sVar1 < sVar75) * sVar1 | (ushort)(sVar1 >= sVar75) * sVar75;
  sVar2 = auVar111._6_2_;
  sVar75 = auVar84._6_2_;
  uVar92 = (ushort)(sVar2 < sVar75) * sVar2 | (ushort)(sVar2 >= sVar75) * sVar75;
  sVar3 = auVar111._8_2_;
  sVar75 = auVar84._8_2_;
  uVar93 = (ushort)(sVar3 < sVar75) * sVar3 | (ushort)(sVar3 >= sVar75) * sVar75;
  sVar4 = auVar111._10_2_;
  sVar75 = auVar84._10_2_;
  uVar94 = (ushort)(sVar4 < sVar75) * sVar4 | (ushort)(sVar4 >= sVar75) * sVar75;
  sVar5 = auVar111._12_2_;
  sVar75 = auVar84._12_2_;
  sVar76 = auVar84._14_2_;
  uVar95 = (ushort)(sVar5 < sVar75) * sVar5 | (ushort)(sVar5 >= sVar75) * sVar75;
  sVar6 = auVar111._14_2_;
  uVar96 = (ushort)(sVar6 < sVar76) * sVar6 | (ushort)(sVar6 >= sVar76) * sVar76;
  sVar75 = auVar101._0_2_;
  auVar111._0_2_ = (ushort)((short)uVar87 < sVar75) * sVar75 | ((short)uVar87 >= sVar75) * uVar87;
  sVar76 = auVar101._2_2_;
  auVar111._2_2_ = (ushort)((short)uVar90 < sVar76) * sVar76 | ((short)uVar90 >= sVar76) * uVar90;
  sVar77 = auVar101._4_2_;
  auVar111._4_2_ = (ushort)((short)uVar91 < sVar77) * sVar77 | ((short)uVar91 >= sVar77) * uVar91;
  sVar78 = auVar101._6_2_;
  auVar111._6_2_ = (ushort)((short)uVar92 < sVar78) * sVar78 | ((short)uVar92 >= sVar78) * uVar92;
  sVar79 = auVar101._8_2_;
  auVar111._8_2_ = (ushort)((short)uVar93 < sVar79) * sVar79 | ((short)uVar93 >= sVar79) * uVar93;
  sVar80 = auVar101._10_2_;
  auVar111._10_2_ = (ushort)((short)uVar94 < sVar80) * sVar80 | ((short)uVar94 >= sVar80) * uVar94;
  sVar81 = auVar101._12_2_;
  auVar111._12_2_ = (ushort)((short)uVar95 < sVar81) * sVar81 | ((short)uVar95 >= sVar81) * uVar95;
  sVar82 = auVar101._14_2_;
  auVar111._14_2_ = (ushort)((short)uVar96 < sVar82) * sVar82 | ((short)uVar96 >= sVar82) * uVar96;
  auVar101 = psubsw(auVar126,auVar124);
  auVar84 = paddsw(auVar111 & auVar113,auVar101);
  auVar84 = paddsw(auVar84,auVar101);
  auVar84 = paddsw(auVar84,auVar101);
  sVar88 = auVar84._0_2_;
  uVar87 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar88 = auVar84._2_2_;
  uVar90 = (ushort)(sVar123 < sVar88) * sVar123 | (ushort)(sVar123 >= sVar88) * sVar88;
  sVar88 = auVar84._4_2_;
  uVar91 = (ushort)(sVar1 < sVar88) * sVar1 | (ushort)(sVar1 >= sVar88) * sVar88;
  sVar88 = auVar84._6_2_;
  uVar92 = (ushort)(sVar2 < sVar88) * sVar2 | (ushort)(sVar2 >= sVar88) * sVar88;
  sVar88 = auVar84._8_2_;
  uVar93 = (ushort)(sVar3 < sVar88) * sVar3 | (ushort)(sVar3 >= sVar88) * sVar88;
  sVar88 = auVar84._10_2_;
  uVar94 = (ushort)(sVar4 < sVar88) * sVar4 | (ushort)(sVar4 >= sVar88) * sVar88;
  sVar88 = auVar84._12_2_;
  sVar97 = auVar84._14_2_;
  uVar95 = (ushort)(sVar5 < sVar88) * sVar5 | (ushort)(sVar5 >= sVar88) * sVar88;
  uVar96 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  auVar101._0_2_ = (ushort)((short)uVar87 < sVar75) * sVar75 | ((short)uVar87 >= sVar75) * uVar87;
  auVar101._2_2_ = (ushort)((short)uVar90 < sVar76) * sVar76 | ((short)uVar90 >= sVar76) * uVar90;
  auVar101._4_2_ = (ushort)((short)uVar91 < sVar77) * sVar77 | ((short)uVar91 >= sVar77) * uVar91;
  auVar101._6_2_ = (ushort)((short)uVar92 < sVar78) * sVar78 | ((short)uVar92 >= sVar78) * uVar92;
  auVar101._8_2_ = (ushort)((short)uVar93 < sVar79) * sVar79 | ((short)uVar93 >= sVar79) * uVar93;
  auVar101._10_2_ = (ushort)((short)uVar94 < sVar80) * sVar80 | ((short)uVar94 >= sVar80) * uVar94;
  auVar101._12_2_ = (ushort)((short)uVar95 < sVar81) * sVar81 | ((short)uVar95 >= sVar81) * uVar95;
  auVar101._14_2_ = (ushort)((short)uVar96 < sVar82) * sVar82 | ((short)uVar96 >= sVar82) * uVar96;
  auVar133 = auVar133 ^ _DAT_004d28e0;
  auVar127 = auVar127 ^ _DAT_004d28e0;
  auVar134._0_2_ = -(ushort)(auVar127._0_2_ < auVar133._0_2_);
  auVar134._2_2_ = -(ushort)(auVar127._2_2_ < auVar133._2_2_);
  auVar134._4_2_ = -(ushort)(auVar127._4_2_ < auVar133._4_2_);
  auVar134._6_2_ = -(ushort)(auVar127._6_2_ < auVar133._6_2_);
  auVar134._8_2_ = -(ushort)(auVar127._8_2_ < auVar133._8_2_);
  auVar134._10_2_ = -(ushort)(auVar127._10_2_ < auVar133._10_2_);
  auVar134._12_2_ = -(ushort)(auVar127._12_2_ < auVar133._12_2_);
  auVar134._14_2_ = -(ushort)(auVar127._14_2_ < auVar133._14_2_);
  auVar84 = paddsw(_DAT_005016c0,~auVar130 & auVar101);
  auVar111 = paddsw(~auVar130 & auVar101,_DAT_0050d520);
  auVar134 = auVar134 | auVar130;
  sVar88 = auVar111._0_2_;
  uVar87 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar88 = auVar111._2_2_;
  uVar90 = (ushort)(sVar123 < sVar88) * sVar123 | (ushort)(sVar123 >= sVar88) * sVar88;
  sVar88 = auVar111._4_2_;
  uVar91 = (ushort)(sVar1 < sVar88) * sVar1 | (ushort)(sVar1 >= sVar88) * sVar88;
  sVar88 = auVar111._6_2_;
  uVar92 = (ushort)(sVar2 < sVar88) * sVar2 | (ushort)(sVar2 >= sVar88) * sVar88;
  sVar88 = auVar111._8_2_;
  uVar93 = (ushort)(sVar3 < sVar88) * sVar3 | (ushort)(sVar3 >= sVar88) * sVar88;
  sVar88 = auVar111._10_2_;
  uVar94 = (ushort)(sVar4 < sVar88) * sVar4 | (ushort)(sVar4 >= sVar88) * sVar88;
  sVar88 = auVar111._12_2_;
  sVar97 = auVar111._14_2_;
  uVar95 = (ushort)(sVar5 < sVar88) * sVar5 | (ushort)(sVar5 >= sVar88) * sVar88;
  uVar96 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  auVar136._0_2_ = (ushort)((short)uVar87 < sVar75) * sVar75 | ((short)uVar87 >= sVar75) * uVar87;
  auVar136._2_2_ = (ushort)((short)uVar90 < sVar76) * sVar76 | ((short)uVar90 >= sVar76) * uVar90;
  auVar136._4_2_ = (ushort)((short)uVar91 < sVar77) * sVar77 | ((short)uVar91 >= sVar77) * uVar91;
  auVar136._6_2_ = (ushort)((short)uVar92 < sVar78) * sVar78 | ((short)uVar92 >= sVar78) * uVar92;
  auVar136._8_2_ = (ushort)((short)uVar93 < sVar79) * sVar79 | ((short)uVar93 >= sVar79) * uVar93;
  auVar136._10_2_ = (ushort)((short)uVar94 < sVar80) * sVar80 | ((short)uVar94 >= sVar80) * uVar94;
  auVar136._12_2_ = (ushort)((short)uVar95 < sVar81) * sVar81 | ((short)uVar95 >= sVar81) * uVar95;
  auVar136._14_2_ = (ushort)((short)uVar96 < sVar82) * sVar82 | ((short)uVar96 >= sVar82) * uVar96;
  auVar111 = psraw(auVar136,3);
  auVar130 = paddsw(auVar111,auVar124);
  sVar88 = auVar84._0_2_;
  uVar87 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar88 = auVar84._2_2_;
  uVar90 = (ushort)(sVar123 < sVar88) * sVar123 | (ushort)(sVar123 >= sVar88) * sVar88;
  sVar88 = auVar84._4_2_;
  uVar91 = (ushort)(sVar1 < sVar88) * sVar1 | (ushort)(sVar1 >= sVar88) * sVar88;
  sVar88 = auVar84._6_2_;
  uVar92 = (ushort)(sVar2 < sVar88) * sVar2 | (ushort)(sVar2 >= sVar88) * sVar88;
  sVar88 = auVar84._8_2_;
  uVar93 = (ushort)(sVar3 < sVar88) * sVar3 | (ushort)(sVar3 >= sVar88) * sVar88;
  sVar88 = auVar84._10_2_;
  uVar94 = (ushort)(sVar4 < sVar88) * sVar4 | (ushort)(sVar4 >= sVar88) * sVar88;
  sVar88 = auVar84._12_2_;
  sVar97 = auVar84._14_2_;
  uVar95 = (ushort)(sVar5 < sVar88) * sVar5 | (ushort)(sVar5 >= sVar88) * sVar88;
  uVar96 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  auVar124._0_2_ = (ushort)((short)uVar87 < sVar75) * sVar75 | ((short)uVar87 >= sVar75) * uVar87;
  auVar124._2_2_ = (ushort)((short)uVar90 < sVar76) * sVar76 | ((short)uVar90 >= sVar76) * uVar90;
  auVar124._4_2_ = (ushort)((short)uVar91 < sVar77) * sVar77 | ((short)uVar91 >= sVar77) * uVar91;
  auVar124._6_2_ = (ushort)((short)uVar92 < sVar78) * sVar78 | ((short)uVar92 >= sVar78) * uVar92;
  auVar124._8_2_ = (ushort)((short)uVar93 < sVar79) * sVar79 | ((short)uVar93 >= sVar79) * uVar93;
  auVar124._10_2_ = (ushort)((short)uVar94 < sVar80) * sVar80 | ((short)uVar94 >= sVar80) * uVar94;
  auVar124._12_2_ = (ushort)((short)uVar95 < sVar81) * sVar81 | ((short)uVar95 >= sVar81) * uVar95;
  auVar124._14_2_ = (ushort)((short)uVar96 < sVar82) * sVar82 | ((short)uVar96 >= sVar82) * uVar96;
  auVar84 = psraw(auVar124,3);
  auVar111 = psubsw(auVar126,auVar84);
  auVar126._0_2_ = auVar84._0_2_ + 1;
  auVar126._2_2_ = auVar84._2_2_ + 1;
  auVar126._4_2_ = auVar84._4_2_ + 1;
  auVar126._6_2_ = auVar84._6_2_ + 1;
  auVar126._8_2_ = auVar84._8_2_ + 1;
  auVar126._10_2_ = auVar84._10_2_ + 1;
  auVar126._12_2_ = auVar84._12_2_ + 1;
  auVar126._14_2_ = auVar84._14_2_ + 1;
  auVar84 = psraw(auVar126,1);
  auVar101 = psubsw(auVar129,~auVar113 & auVar84);
  auVar85 = paddsw(~auVar113 & auVar84,auVar85);
  sVar88 = auVar111._0_2_;
  uVar87 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar88 = auVar111._2_2_;
  uVar90 = (ushort)(sVar123 < sVar88) * sVar123 | (ushort)(sVar123 >= sVar88) * sVar88;
  sVar88 = auVar111._4_2_;
  uVar91 = (ushort)(sVar1 < sVar88) * sVar1 | (ushort)(sVar1 >= sVar88) * sVar88;
  sVar88 = auVar111._6_2_;
  uVar92 = (ushort)(sVar2 < sVar88) * sVar2 | (ushort)(sVar2 >= sVar88) * sVar88;
  sVar88 = auVar111._8_2_;
  uVar93 = (ushort)(sVar3 < sVar88) * sVar3 | (ushort)(sVar3 >= sVar88) * sVar88;
  sVar88 = auVar111._10_2_;
  uVar94 = (ushort)(sVar4 < sVar88) * sVar4 | (ushort)(sVar4 >= sVar88) * sVar88;
  sVar88 = auVar111._12_2_;
  sVar97 = auVar111._14_2_;
  uVar95 = (ushort)(sVar5 < sVar88) * sVar5 | (ushort)(sVar5 >= sVar88) * sVar88;
  uVar96 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  sVar88 = auVar130._0_2_;
  uVar135 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar88 = auVar130._2_2_;
  uVar138 = (ushort)(sVar123 < sVar88) * sVar123 | (ushort)(sVar123 >= sVar88) * sVar88;
  sVar88 = auVar130._4_2_;
  uVar139 = (ushort)(sVar1 < sVar88) * sVar1 | (ushort)(sVar1 >= sVar88) * sVar88;
  sVar88 = auVar130._6_2_;
  uVar140 = (ushort)(sVar2 < sVar88) * sVar2 | (ushort)(sVar2 >= sVar88) * sVar88;
  sVar88 = auVar130._8_2_;
  uVar141 = (ushort)(sVar3 < sVar88) * sVar3 | (ushort)(sVar3 >= sVar88) * sVar88;
  sVar88 = auVar130._10_2_;
  uVar142 = (ushort)(sVar4 < sVar88) * sVar4 | (ushort)(sVar4 >= sVar88) * sVar88;
  sVar88 = auVar130._12_2_;
  sVar97 = auVar130._14_2_;
  uVar143 = (ushort)(sVar5 < sVar88) * sVar5 | (ushort)(sVar5 >= sVar88) * sVar88;
  uVar144 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  sVar88 = auVar101._0_2_;
  uVar100 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar88 = auVar101._2_2_;
  uVar102 = (ushort)(sVar123 < sVar88) * sVar123 | (ushort)(sVar123 >= sVar88) * sVar88;
  sVar88 = auVar101._4_2_;
  uVar103 = (ushort)(sVar1 < sVar88) * sVar1 | (ushort)(sVar1 >= sVar88) * sVar88;
  sVar88 = auVar101._6_2_;
  uVar104 = (ushort)(sVar2 < sVar88) * sVar2 | (ushort)(sVar2 >= sVar88) * sVar88;
  sVar88 = auVar101._8_2_;
  uVar105 = (ushort)(sVar3 < sVar88) * sVar3 | (ushort)(sVar3 >= sVar88) * sVar88;
  sVar88 = auVar101._10_2_;
  uVar106 = (ushort)(sVar4 < sVar88) * sVar4 | (ushort)(sVar4 >= sVar88) * sVar88;
  sVar88 = auVar101._12_2_;
  sVar97 = auVar101._14_2_;
  uVar107 = (ushort)(sVar5 < sVar88) * sVar5 | (ushort)(sVar5 >= sVar88) * sVar88;
  uVar108 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  sVar88 = auVar85._0_2_;
  uVar110 = (ushort)(sVar116 < sVar88) * sVar116 | (ushort)(sVar116 >= sVar88) * sVar88;
  sVar116 = auVar85._2_2_;
  uVar115 = (ushort)(sVar123 < sVar116) * sVar123 | (ushort)(sVar123 >= sVar116) * sVar116;
  sVar116 = auVar85._4_2_;
  uVar117 = (ushort)(sVar1 < sVar116) * sVar1 | (ushort)(sVar1 >= sVar116) * sVar116;
  sVar116 = auVar85._6_2_;
  uVar118 = (ushort)(sVar2 < sVar116) * sVar2 | (ushort)(sVar2 >= sVar116) * sVar116;
  sVar116 = auVar85._8_2_;
  uVar119 = (ushort)(sVar3 < sVar116) * sVar3 | (ushort)(sVar3 >= sVar116) * sVar116;
  sVar116 = auVar85._10_2_;
  uVar120 = (ushort)(sVar4 < sVar116) * sVar4 | (ushort)(sVar4 >= sVar116) * sVar116;
  sVar116 = auVar85._12_2_;
  sVar123 = auVar85._14_2_;
  uVar121 = (ushort)(sVar5 < sVar116) * sVar5 | (ushort)(sVar5 >= sVar116) * sVar116;
  uVar122 = (ushort)(sVar6 < sVar123) * sVar6 | (ushort)(sVar6 >= sVar123) * sVar123;
  auVar129._0_2_ = (ushort)((short)uVar87 < sVar75) * sVar75 | ((short)uVar87 >= sVar75) * uVar87;
  auVar129._2_2_ = (ushort)((short)uVar90 < sVar76) * sVar76 | ((short)uVar90 >= sVar76) * uVar90;
  auVar129._4_2_ = (ushort)((short)uVar91 < sVar77) * sVar77 | ((short)uVar91 >= sVar77) * uVar91;
  auVar129._6_2_ = (ushort)((short)uVar92 < sVar78) * sVar78 | ((short)uVar92 >= sVar78) * uVar92;
  auVar129._8_2_ = (ushort)((short)uVar93 < sVar79) * sVar79 | ((short)uVar93 >= sVar79) * uVar93;
  auVar129._10_2_ = (ushort)((short)uVar94 < sVar80) * sVar80 | ((short)uVar94 >= sVar80) * uVar94;
  auVar129._12_2_ = (ushort)((short)uVar95 < sVar81) * sVar81 | ((short)uVar95 >= sVar81) * uVar95;
  auVar129._14_2_ = (ushort)((short)uVar96 < sVar82) * sVar82 | ((short)uVar96 >= sVar82) * uVar96;
  auVar137._0_2_ = (ushort)((short)uVar135 < sVar75) * sVar75 | ((short)uVar135 >= sVar75) * uVar135
  ;
  auVar137._2_2_ = (ushort)((short)uVar138 < sVar76) * sVar76 | ((short)uVar138 >= sVar76) * uVar138
  ;
  auVar137._4_2_ = (ushort)((short)uVar139 < sVar77) * sVar77 | ((short)uVar139 >= sVar77) * uVar139
  ;
  auVar137._6_2_ = (ushort)((short)uVar140 < sVar78) * sVar78 | ((short)uVar140 >= sVar78) * uVar140
  ;
  auVar137._8_2_ = (ushort)((short)uVar141 < sVar79) * sVar79 | ((short)uVar141 >= sVar79) * uVar141
  ;
  auVar137._10_2_ =
       (ushort)((short)uVar142 < sVar80) * sVar80 | ((short)uVar142 >= sVar80) * uVar142;
  auVar137._12_2_ =
       (ushort)((short)uVar143 < sVar81) * sVar81 | ((short)uVar143 >= sVar81) * uVar143;
  auVar137._14_2_ =
       (ushort)((short)uVar144 < sVar82) * sVar82 | ((short)uVar144 >= sVar82) * uVar144;
  auVar109._0_2_ = (ushort)((short)uVar100 < sVar75) * sVar75 | ((short)uVar100 >= sVar75) * uVar100
  ;
  auVar109._2_2_ = (ushort)((short)uVar102 < sVar76) * sVar76 | ((short)uVar102 >= sVar76) * uVar102
  ;
  auVar109._4_2_ = (ushort)((short)uVar103 < sVar77) * sVar77 | ((short)uVar103 >= sVar77) * uVar103
  ;
  auVar109._6_2_ = (ushort)((short)uVar104 < sVar78) * sVar78 | ((short)uVar104 >= sVar78) * uVar104
  ;
  auVar109._8_2_ = (ushort)((short)uVar105 < sVar79) * sVar79 | ((short)uVar105 >= sVar79) * uVar105
  ;
  auVar109._10_2_ =
       (ushort)((short)uVar106 < sVar80) * sVar80 | ((short)uVar106 >= sVar80) * uVar106;
  auVar109._12_2_ =
       (ushort)((short)uVar107 < sVar81) * sVar81 | ((short)uVar107 >= sVar81) * uVar107;
  auVar109._14_2_ =
       (ushort)((short)uVar108 < sVar82) * sVar82 | ((short)uVar108 >= sVar82) * uVar108;
  auVar114._0_2_ = (ushort)((short)uVar110 < sVar75) * sVar75 | ((short)uVar110 >= sVar75) * uVar110
  ;
  auVar114._2_2_ = (ushort)((short)uVar115 < sVar76) * sVar76 | ((short)uVar115 >= sVar76) * uVar115
  ;
  auVar114._4_2_ = (ushort)((short)uVar117 < sVar77) * sVar77 | ((short)uVar117 >= sVar77) * uVar117
  ;
  auVar114._6_2_ = (ushort)((short)uVar118 < sVar78) * sVar78 | ((short)uVar118 >= sVar78) * uVar118
  ;
  auVar114._8_2_ = (ushort)((short)uVar119 < sVar79) * sVar79 | ((short)uVar119 >= sVar79) * uVar119
  ;
  auVar114._10_2_ =
       (ushort)((short)uVar120 < sVar80) * sVar80 | ((short)uVar120 >= sVar80) * uVar120;
  auVar114._12_2_ =
       (ushort)((short)uVar121 < sVar81) * sVar81 | ((short)uVar121 >= sVar81) * uVar121;
  auVar114._14_2_ =
       (ushort)((short)uVar122 < sVar82) * sVar82 | ((short)uVar122 >= sVar82) * uVar122;
  auVar85 = paddsw(auVar129,auVar89);
  auVar111 = paddsw(auVar137,auVar89);
  auVar84 = paddsw(auVar109,auVar89);
  auVar89 = paddsw(auVar114,auVar89);
  if ((ushort)((ushort)(SUB161(auVar134 >> 7,0) & 1) | (ushort)(SUB161(auVar134 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar134 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar134 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar134 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar134 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar134 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar134 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar134 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar134 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar134 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar134 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar134 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar134 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar134 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar134[0xf] >> 7) << 0xf) != 0xffff) {
    local_48 = auVar98._0_2_;
    sStack_46 = auVar98._2_2_;
    sStack_44 = auVar98._4_2_;
    sStack_42 = auVar98._6_2_;
    sStack_40 = auVar98._8_2_;
    sStack_3e = auVar98._10_2_;
    sStack_3c = auVar98._12_2_;
    sStack_3a = auVar98._14_2_;
    local_38 = auVar86._0_2_;
    sStack_36 = auVar86._2_2_;
    sStack_34 = auVar86._4_2_;
    sStack_32 = auVar86._6_2_;
    sStack_30 = auVar86._8_2_;
    sStack_2e = auVar86._10_2_;
    sStack_2c = auVar86._12_2_;
    sStack_2a = auVar86._14_2_;
    local_28 = auVar83._0_2_;
    sStack_26 = auVar83._2_2_;
    sStack_24 = auVar83._4_2_;
    sStack_22 = auVar83._6_2_;
    sStack_20 = auVar83._8_2_;
    sStack_1e = auVar83._10_2_;
    sStack_1c = auVar83._12_2_;
    sStack_1a = auVar83._14_2_;
    sVar75 = (local_48 + local_38) * 2 + local_28 + 4;
    sVar76 = (sStack_46 + sStack_36) * 2 + sStack_26 + 4;
    sVar77 = (sStack_44 + sStack_34) * 2 + sStack_24 + 4;
    sVar78 = (sStack_42 + sStack_32) * 2 + sStack_22 + 4;
    sVar79 = (sStack_40 + sStack_30) * 2 + sStack_20 + 4;
    sVar80 = (sStack_3e + sStack_2e) * 2 + sStack_1e + 4;
    sVar81 = (sStack_3c + sStack_2c) * 2 + sStack_1c + 4;
    sVar82 = (sStack_3a + sStack_2a) * 2 + sStack_1a + 4;
    auVar86._0_2_ = (ushort)(local_28 * 2 + auVar99._0_2_ + sVar75) >> 3;
    auVar86._2_2_ = (ushort)(sStack_26 * 2 + auVar99._2_2_ + sVar76) >> 3;
    auVar86._4_2_ = (ushort)(sStack_24 * 2 + auVar99._4_2_ + sVar77) >> 3;
    auVar86._6_2_ = (ushort)(sStack_22 * 2 + auVar99._6_2_ + sVar78) >> 3;
    auVar86._8_2_ = (ushort)(sStack_20 * 2 + auVar99._8_2_ + sVar79) >> 3;
    auVar86._10_2_ = (ushort)(sStack_1e * 2 + auVar99._10_2_ + sVar80) >> 3;
    auVar86._12_2_ = (ushort)(sStack_1c * 2 + auVar99._12_2_ + sVar81) >> 3;
    auVar86._14_2_ = (ushort)(sStack_1a * 2 + auVar99._14_2_ + sVar82) >> 3;
    uVar87 = auVar99._0_2_ * 2 + auVar125._0_2_ + sVar75;
    uVar90 = auVar99._2_2_ * 2 + auVar125._2_2_ + sVar76;
    uVar91 = auVar99._4_2_ * 2 + auVar125._4_2_ + sVar77;
    uVar92 = auVar99._6_2_ * 2 + auVar125._6_2_ + sVar78;
    uVar93 = auVar99._8_2_ * 2 + auVar125._8_2_ + sVar79;
    uVar94 = auVar99._10_2_ * 2 + auVar125._10_2_ + sVar80;
    uVar95 = auVar99._12_2_ * 2 + auVar125._12_2_ + sVar81;
    uVar96 = auVar99._14_2_ * 2 + auVar125._14_2_ + sVar82;
    uVar100 = (auVar125._0_2_ - (local_38 + local_28)) + auVar128._0_2_ + uVar87;
    uVar102 = (auVar125._2_2_ - (sStack_36 + sStack_26)) + auVar128._2_2_ + uVar90;
    uVar103 = (auVar125._4_2_ - (sStack_34 + sStack_24)) + auVar128._4_2_ + uVar91;
    uVar104 = (auVar125._6_2_ - (sStack_32 + sStack_22)) + auVar128._6_2_ + uVar92;
    uVar105 = (auVar125._8_2_ - (sStack_30 + sStack_20)) + auVar128._8_2_ + uVar93;
    uVar106 = (auVar125._10_2_ - (sStack_2e + sStack_1e)) + auVar128._10_2_ + uVar94;
    uVar107 = (auVar125._12_2_ - (sStack_2c + sStack_1c)) + auVar128._12_2_ + uVar95;
    uVar108 = (auVar125._14_2_ - (sStack_2a + sStack_1a)) + auVar128._14_2_ + uVar96;
    auVar83._0_2_ = uVar87 >> 3;
    auVar83._2_2_ = uVar90 >> 3;
    auVar83._4_2_ = uVar91 >> 3;
    auVar83._6_2_ = uVar92 >> 3;
    auVar83._8_2_ = uVar93 >> 3;
    auVar83._10_2_ = uVar94 >> 3;
    auVar83._12_2_ = uVar95 >> 3;
    auVar83._14_2_ = uVar96 >> 3;
    auVar98._0_2_ = uVar100 >> 3;
    auVar98._2_2_ = uVar102 >> 3;
    auVar98._4_2_ = uVar103 >> 3;
    auVar98._6_2_ = uVar104 >> 3;
    auVar98._8_2_ = uVar105 >> 3;
    auVar98._10_2_ = uVar106 >> 3;
    auVar98._12_2_ = uVar107 >> 3;
    auVar98._14_2_ = uVar108 >> 3;
    auVar99._0_2_ = (ushort)((auVar128._0_2_ * 2 - (local_48 + local_38)) + uVar100) >> 3;
    auVar99._2_2_ = (ushort)((auVar128._2_2_ * 2 - (sStack_46 + sStack_36)) + uVar102) >> 3;
    auVar99._4_2_ = (ushort)((auVar128._4_2_ * 2 - (sStack_44 + sStack_34)) + uVar103) >> 3;
    auVar99._6_2_ = (ushort)((auVar128._6_2_ * 2 - (sStack_42 + sStack_32)) + uVar104) >> 3;
    auVar99._8_2_ = (ushort)((auVar128._8_2_ * 2 - (sStack_40 + sStack_30)) + uVar105) >> 3;
    auVar99._10_2_ = (ushort)((auVar128._10_2_ * 2 - (sStack_3e + sStack_2e)) + uVar106) >> 3;
    auVar99._12_2_ = (ushort)((auVar128._12_2_ * 2 - (sStack_3c + sStack_2c)) + uVar107) >> 3;
    auVar99._14_2_ = (ushort)((auVar128._14_2_ * 2 - (sStack_3a + sStack_2a)) + uVar108) >> 3;
    auVar85 = auVar85 & auVar134 | ~auVar134 & auVar98;
    auVar84 = auVar84 & auVar134 | ~auVar134 & auVar99;
    auVar111 = auVar111 & auVar134 | ~auVar134 & auVar83;
    auVar89 = auVar89 & auVar134 | ~auVar134 & auVar86;
  }
  *(undefined1 (*) [16])(s + -lVar74) = auVar89;
  *(undefined1 (*) [16])(s + -lVar73) = auVar111;
  *(undefined1 (*) [16])s = auVar85;
  *(undefined1 (*) [16])(s + lVar73) = auVar84;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p2, p1, p0, q0, q1, q2;

  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s + 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
  _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
  _mm_storeu_si128((__m128i *)(s + 0 * p), q0);
  _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
}